

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_update_id(bcf_hdr_t *hdr,bcf1_t *line,char *id)

{
  undefined1 local_38 [8];
  kstring_t tmp;
  char *id_local;
  bcf1_t *line_local;
  bcf_hdr_t *hdr_local;
  
  local_38 = (undefined1  [8])0x0;
  tmp.m = (size_t)(line->d).id;
  tmp.l = (size_t)(line->d).m_id;
  tmp.s = id;
  if (id == (char *)0x0) {
    kputs(".",(kstring_t *)local_38);
  }
  else {
    kputs(id,(kstring_t *)local_38);
  }
  (line->d).id = (char *)tmp.m;
  (line->d).m_id = (int)tmp.l;
  (line->d).shared_dirty = (line->d).shared_dirty | 1;
  return 0;
}

Assistant:

int bcf_update_id(const bcf_hdr_t *hdr, bcf1_t *line, const char *id)
{
    kstring_t tmp;
    tmp.l = 0; tmp.s = line->d.id; tmp.m = line->d.m_id;
    if ( id )
        kputs(id, &tmp);
    else
        kputs(".", &tmp);
    line->d.id = tmp.s; line->d.m_id = tmp.m;
    line->d.shared_dirty |= BCF1_DIRTY_ID;
    return 0;
}